

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaExporter::WriteNode(ColladaExporter *this,aiScene *pScene,aiNode *pNode)

{
  aiString *paVar1;
  aiNode *paVar2;
  bool bVar3;
  ostream *poVar4;
  char *pcVar5;
  aiBone *paVar6;
  reference name;
  ulong local_518;
  size_t a_2;
  size_t a_1;
  allocator<char> local_4e1;
  string local_4e0;
  string local_4c0;
  aiNode *local_4a0;
  aiNode *skeletonRootBoneNode;
  string local_478;
  byte local_452;
  allocator<char> local_451;
  undefined1 local_450 [8];
  string meshName;
  aiMesh *mesh;
  size_t a;
  size_t i_2;
  size_t i_1;
  undefined1 local_3d0 [8];
  aiMatrix4x4 colladaView;
  aiMatrix4x4 sourceView;
  size_t i;
  float local_340;
  aiMatrix4x4 mat;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  byte local_2bb;
  allocator<char> local_2ba;
  byte local_2b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  allocator<char> local_271;
  string local_270;
  undefined1 local_250 [8];
  string node_name;
  string local_228;
  undefined1 local_208 [8];
  string node_id;
  bool is_skeleton_root;
  char *pcStack_1e0;
  bool is_joint;
  char *node_type;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  aiNode *local_20;
  aiNode *pNode_local;
  aiScene *pScene_local;
  ColladaExporter *this_local;
  
  local_20 = pNode;
  pNode_local = (aiNode *)pScene;
  pScene_local = (aiScene *)this;
  if ((pNode->mName).length == 0) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar4 = std::operator<<(local_198,"Node_");
    std::ostream::operator<<(poVar4,local_20);
    paVar2 = local_20;
    std::__cxx11::stringstream::str();
    aiString::Set(&paVar2->mName,(string *)&node_type);
    std::__cxx11::string::~string((string *)&node_type);
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  paVar2 = pNode_local;
  node_id.field_2._M_local_buf[0xe] = '\0';
  pcVar5 = aiString::C_Str(&local_20->mName);
  paVar6 = findBone((aiScene *)paVar2,pcVar5);
  paVar2 = pNode_local;
  if (paVar6 == (aiBone *)0x0) {
    pcStack_1e0 = "NODE";
    node_id.field_2._M_local_buf[0xf] = '\0';
  }
  else {
    pcStack_1e0 = "JOINT";
    node_id.field_2._M_local_buf[0xf] = '\x01';
    if (local_20->mParent != (aiNode *)0x0) {
      pcVar5 = aiString::C_Str(&local_20->mParent->mName);
      paVar6 = findBone((aiScene *)paVar2,pcVar5);
      if (paVar6 != (aiBone *)0x0) goto LAB_00461e96;
    }
    node_id.field_2._M_local_buf[0xe] = '\x01';
  }
LAB_00461e96:
  paVar1 = &local_20->mName;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,paVar1->data,
             (allocator<char> *)(node_name.field_2._M_local_buf + 0xf));
  XMLIDEncode((string *)local_208,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)(node_name.field_2._M_local_buf + 0xf));
  paVar1 = &local_20->mName;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,paVar1->data,&local_271);
  XMLEscape((string *)local_250,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  poVar4 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  std::operator<<(poVar4,"<node ");
  if ((node_id.field_2._M_local_buf[0xe] & 1U) == 0) {
    poVar4 = std::operator<<((ostream *)&this->field_0x38,"id=\"");
    poVar4 = std::operator<<(poVar4,(string *)local_208);
    poVar4 = std::operator<<(poVar4,"\" ");
    mat.d3._3_1_ = 0;
    mat.d3._1_1_ = 0;
    if ((node_id.field_2._M_local_buf[0xf] & 1U) == 0) {
      std::allocator<char>::allocator();
      mat.d3._1_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e0,"",(allocator<char> *)((long)&mat.d3 + 2));
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat.d4,
                     "sid=\"",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_208);
      mat.d3._3_1_ = 1;
      std::operator+(&local_2e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat.d4,
                     "\"");
    }
    std::operator<<(poVar4,(string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    if ((mat.d3._1_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&mat.d3 + 2));
    }
    if ((mat.d3._3_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&mat.d4);
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&this->field_0x38,"id=\"");
    poVar4 = std::operator<<(poVar4,(string *)local_208);
    poVar4 = std::operator<<(poVar4,"\" ");
    local_2b9 = 0;
    local_2bb = 0;
    if ((node_id.field_2._M_local_buf[0xf] & 1U) == 0) {
      std::allocator<char>::allocator();
      local_2bb = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"",&local_2ba);
    }
    else {
      std::operator+(&local_2b8,"sid=\"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208)
      ;
      local_2b9 = 1;
      std::operator+(&local_298,&local_2b8,"\"");
    }
    std::operator<<(poVar4,(string *)&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    if ((local_2bb & 1) != 0) {
      std::allocator<char>::~allocator(&local_2ba);
    }
    if ((local_2b9 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_2b8);
    }
    std::__cxx11::string::operator=((string *)&this->mFoundSkeletonRootNodeID,(string *)local_208);
  }
  poVar4 = std::operator<<((ostream *)&this->field_0x38," name=\"");
  poVar4 = std::operator<<(poVar4,(string *)local_250);
  poVar4 = std::operator<<(poVar4,"\" type=\"");
  poVar4 = std::operator<<(poVar4,pcStack_1e0);
  poVar4 = std::operator<<(poVar4,"\">");
  std::operator<<(poVar4,(string *)&this->endstr);
  PushTag(this);
  memcpy((void *)((long)&i + 4),&local_20->mTransformation,0x40);
  sourceView.d3 = 0.0;
  sourceView.d4 = 0.0;
  for (; (ulong)sourceView._56_8_ < (ulong)this->mScene->mNumCameras;
      sourceView._56_8_ = sourceView._56_8_ + 1) {
    bVar3 = aiString::operator==(&this->mScene->mCameras[sourceView._56_8_]->mName,&local_20->mName)
    ;
    if (bVar3) {
      aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&colladaView.d3);
      aiCamera::GetCameraMatrix
                (this->mScene->mCameras[sourceView._56_8_],(aiMatrix4x4 *)&colladaView.d3);
      aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_3d0);
      colladaView.c1 = -1.0;
      local_3d0._0_4_ = -1.0;
      aiMatrix4x4t<float>::operator*
                ((aiMatrix4x4t<float> *)&i_1,(aiMatrix4x4t<float> *)&colladaView.d3,
                 (aiMatrix4x4t<float> *)local_3d0);
      aiMatrix4x4t<float>::operator*=
                ((aiMatrix4x4t<float> *)((long)&i + 4),(aiMatrix4x4t<float> *)&i_1);
      break;
    }
  }
  poVar4 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  std::operator<<(poVar4,"<matrix sid=\"matrix\">");
  poVar4 = (ostream *)std::ostream::operator<<(&this->field_0x38,i._4_4_);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_340);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,mat.a1);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,mat.a2);
  std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(&this->field_0x38,mat.a3);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,mat.a4);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,mat.b1);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,mat.b2);
  std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(&this->field_0x38,mat.b3);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,mat.b4);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,mat.c1);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,mat.c2);
  std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(&this->field_0x38,mat.c3);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,mat.c4);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,mat.d1);
  poVar4 = std::operator<<(poVar4," ");
  std::ostream::operator<<(poVar4,mat.d2);
  poVar4 = std::operator<<((ostream *)&this->field_0x38,"</matrix>");
  std::operator<<(poVar4,(string *)&this->endstr);
  if (local_20->mNumMeshes == 0) {
    for (i_2 = 0; i_2 < this->mScene->mNumCameras; i_2 = i_2 + 1) {
      bVar3 = aiString::operator==(&this->mScene->mCameras[i_2]->mName,&local_20->mName);
      if (bVar3) {
        poVar4 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
        poVar4 = std::operator<<(poVar4,"<instance_camera url=\"#");
        poVar4 = std::operator<<(poVar4,(string *)local_208);
        poVar4 = std::operator<<(poVar4,"-camera\"/>");
        std::operator<<(poVar4,(string *)&this->endstr);
        break;
      }
    }
    for (a = 0; a < this->mScene->mNumLights; a = a + 1) {
      bVar3 = aiString::operator==(&this->mScene->mLights[a]->mName,&local_20->mName);
      if (bVar3) {
        poVar4 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
        poVar4 = std::operator<<(poVar4,"<instance_light url=\"#");
        poVar4 = std::operator<<(poVar4,(string *)local_208);
        poVar4 = std::operator<<(poVar4,"-light\"/>");
        std::operator<<(poVar4,(string *)&this->endstr);
        break;
      }
    }
  }
  else {
    for (mesh = (aiMesh *)0x0; mesh < (aiMesh *)(ulong)local_20->mNumMeshes;
        mesh = (aiMesh *)((long)&mesh->mPrimitiveTypes + 1)) {
      meshName.field_2._8_8_ = this->mScene->mMeshes[local_20->mMeshes[(long)mesh]];
      if ((((aiMesh *)meshName.field_2._8_8_)->mNumFaces != 0) &&
         (((aiMesh *)meshName.field_2._8_8_)->mNumVertices != 0)) {
        local_452 = 0;
        if ((((aiMesh *)meshName.field_2._8_8_)->mName).length == 0) {
          GetMeshId_abi_cxx11_((string *)local_450,this,(ulong)local_20->mMeshes[(long)mesh]);
        }
        else {
          pcVar5 = aiString::C_Str(&((aiMesh *)meshName.field_2._8_8_)->mName);
          std::allocator<char>::allocator();
          local_452 = 1;
          std::__cxx11::string::string<std::allocator<char>>((string *)local_450,pcVar5,&local_451);
        }
        if ((local_452 & 1) != 0) {
          std::allocator<char>::~allocator(&local_451);
        }
        if (*(int *)(meshName.field_2._8_8_ + 0xd8) == 0) {
          poVar4 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
          poVar4 = std::operator<<(poVar4,"<instance_geometry url=\"#");
          XMLIDEncode(&local_478,(string *)local_450);
          poVar4 = std::operator<<(poVar4,(string *)&local_478);
          poVar4 = std::operator<<(poVar4,"\">");
          std::operator<<(poVar4,(string *)&this->endstr);
          std::__cxx11::string::~string((string *)&local_478);
          PushTag(this);
        }
        else {
          poVar4 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
          poVar4 = std::operator<<(poVar4,"<instance_controller url=\"#");
          XMLIDEncode((string *)&skeletonRootBoneNode,(string *)local_450);
          poVar4 = std::operator<<(poVar4,(string *)&skeletonRootBoneNode);
          poVar4 = std::operator<<(poVar4,"-skin\">");
          std::operator<<(poVar4,(string *)&this->endstr);
          std::__cxx11::string::~string((string *)&skeletonRootBoneNode);
          PushTag(this);
          local_4a0 = findSkeletonRootNode((aiScene *)pNode_local,(aiMesh *)meshName.field_2._8_8_);
          if (local_4a0 != (aiNode *)0x0) {
            pcVar5 = aiString::C_Str(&local_4a0->mName);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4e0,pcVar5,&local_4e1);
            XMLIDEncode(&local_4c0,&local_4e0);
            std::__cxx11::string::operator=
                      ((string *)&this->mFoundSkeletonRootNodeID,(string *)&local_4c0);
            std::__cxx11::string::~string((string *)&local_4c0);
            std::__cxx11::string::~string((string *)&local_4e0);
            std::allocator<char>::~allocator(&local_4e1);
          }
          poVar4 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
          poVar4 = std::operator<<(poVar4,"<skeleton>#");
          poVar4 = std::operator<<(poVar4,(string *)&this->mFoundSkeletonRootNodeID);
          poVar4 = std::operator<<(poVar4,"</skeleton>");
          std::operator<<(poVar4,(string *)&this->endstr);
        }
        poVar4 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
        poVar4 = std::operator<<(poVar4,"<bind_material>");
        std::operator<<(poVar4,(string *)&this->endstr);
        PushTag(this);
        poVar4 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
        poVar4 = std::operator<<(poVar4,"<technique_common>");
        std::operator<<(poVar4,(string *)&this->endstr);
        PushTag(this);
        poVar4 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
        poVar4 = std::operator<<(poVar4,"<instance_material symbol=\"defaultMaterial\" target=\"#");
        name = std::
               vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
               ::operator[](&this->materials,(ulong)*(uint *)(meshName.field_2._8_8_ + 0xe8));
        XMLIDEncode((string *)&a_1,&name->name);
        poVar4 = std::operator<<(poVar4,(string *)&a_1);
        poVar4 = std::operator<<(poVar4,"\">");
        std::operator<<(poVar4,(string *)&this->endstr);
        std::__cxx11::string::~string((string *)&a_1);
        PushTag(this);
        for (a_2 = 0; a_2 < 8; a_2 = a_2 + 1) {
          bVar3 = aiMesh::HasTextureCoords((aiMesh *)meshName.field_2._8_8_,(uint)a_2);
          if (bVar3) {
            poVar4 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
            poVar4 = std::operator<<(poVar4,"<bind_vertex_input semantic=\"CHANNEL");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,a_2);
            poVar4 = std::operator<<(poVar4,"\" input_semantic=\"TEXCOORD\" input_set=\"");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,a_2);
            poVar4 = std::operator<<(poVar4,"\"/>");
            std::operator<<(poVar4,(string *)&this->endstr);
          }
        }
        PopTag(this);
        poVar4 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
        poVar4 = std::operator<<(poVar4,"</instance_material>");
        std::operator<<(poVar4,(string *)&this->endstr);
        PopTag(this);
        poVar4 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
        poVar4 = std::operator<<(poVar4,"</technique_common>");
        std::operator<<(poVar4,(string *)&this->endstr);
        PopTag(this);
        poVar4 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
        poVar4 = std::operator<<(poVar4,"</bind_material>");
        std::operator<<(poVar4,(string *)&this->endstr);
        PopTag(this);
        if (*(int *)(meshName.field_2._8_8_ + 0xd8) == 0) {
          poVar4 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
          poVar4 = std::operator<<(poVar4,"</instance_geometry>");
          std::operator<<(poVar4,(string *)&this->endstr);
        }
        else {
          poVar4 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
          poVar4 = std::operator<<(poVar4,"</instance_controller>");
          std::operator<<(poVar4,(string *)&this->endstr);
        }
        std::__cxx11::string::~string((string *)local_450);
      }
    }
  }
  for (local_518 = 0; local_518 < local_20->mNumChildren; local_518 = local_518 + 1) {
    WriteNode(this,(aiScene *)pNode_local,local_20->mChildren[local_518]);
  }
  PopTag(this);
  poVar4 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar4 = std::operator<<(poVar4,"</node>");
  std::operator<<(poVar4,(string *)&this->endstr);
  std::__cxx11::string::~string((string *)local_250);
  std::__cxx11::string::~string((string *)local_208);
  return;
}

Assistant:

void ColladaExporter::WriteNode( const aiScene* pScene, aiNode* pNode)
{
    // the node must have a name
    if (pNode->mName.length == 0)
    {
        std::stringstream ss;
        ss << "Node_" << pNode;
        pNode->mName.Set(ss.str());
    }

    // If the node is associated with a bone, it is a joint node (JOINT)
    // otherwise it is a normal node (NODE)
    const char * node_type;
    bool is_joint, is_skeleton_root = false;
    if (nullptr == findBone(pScene, pNode->mName.C_Str())) {
        node_type = "NODE";
        is_joint = false;
    } else {
        node_type = "JOINT";
        is_joint = true;
        if (!pNode->mParent || nullptr == findBone(pScene, pNode->mParent->mName.C_Str())) {
            is_skeleton_root = true;
        }
    }

    const std::string node_id = XMLIDEncode(pNode->mName.data);
    const std::string node_name = XMLEscape(pNode->mName.data);
	mOutput << startstr << "<node ";
	if(is_skeleton_root) {
		mOutput << "id=\"" << node_id << "\" " << (is_joint ? "sid=\"" + node_id +"\"" : "") ; // For now, only support one skeleton in a scene.
		mFoundSkeletonRootNodeID = node_id;
	} else {
		mOutput << "id=\"" << node_id << "\" " << (is_joint ? "sid=\"" + node_id +"\"": "") ;
	}
	
    mOutput << " name=\"" << node_name
            << "\" type=\"" << node_type
            << "\">" << endstr;
    PushTag();

    // write transformation - we can directly put the matrix there
    // TODO: (thom) decompose into scale - rot - quad to allow addressing it by animations afterwards
    aiMatrix4x4 mat = pNode->mTransformation;

    // If this node is a Camera node, the camera coordinate system needs to be multiplied in.
    // When importing from Collada, the mLookAt is set to 0, 0, -1, and the node transform is unchanged.
    // When importing from a different format, mLookAt is set to 0, 0, 1. Therefore, the local camera
    // coordinate system must be changed to matche the Collada specification.
    for (size_t i = 0; i<mScene->mNumCameras; i++){
        if (mScene->mCameras[i]->mName == pNode->mName){
            aiMatrix4x4 sourceView;
            mScene->mCameras[i]->GetCameraMatrix(sourceView);

            aiMatrix4x4 colladaView;
            colladaView.a1 = colladaView.c3 = -1; // move into -z space.
            mat *= (sourceView * colladaView);
            break;
        }
    }
	
	// customized, sid should be 'matrix' to match with loader code.
    //mOutput << startstr << "<matrix sid=\"transform\">";
	mOutput << startstr << "<matrix sid=\"matrix\">";
	
    mOutput << mat.a1 << " " << mat.a2 << " " << mat.a3 << " " << mat.a4 << " ";
    mOutput << mat.b1 << " " << mat.b2 << " " << mat.b3 << " " << mat.b4 << " ";
    mOutput << mat.c1 << " " << mat.c2 << " " << mat.c3 << " " << mat.c4 << " ";
    mOutput << mat.d1 << " " << mat.d2 << " " << mat.d3 << " " << mat.d4;
    mOutput << "</matrix>" << endstr;

    if(pNode->mNumMeshes==0){
        //check if it is a camera node
        for(size_t i=0; i<mScene->mNumCameras; i++){
            if(mScene->mCameras[i]->mName == pNode->mName){
                mOutput << startstr <<"<instance_camera url=\"#" << node_id << "-camera\"/>" << endstr;
                break;
            }
        }
        //check if it is a light node
        for(size_t i=0; i<mScene->mNumLights; i++){
            if(mScene->mLights[i]->mName == pNode->mName){
                mOutput << startstr <<"<instance_light url=\"#" << node_id << "-light\"/>" << endstr;
                break;
            }
        }

    }else
    // instance every geometry
    for( size_t a = 0; a < pNode->mNumMeshes; ++a )
    {
        const aiMesh* mesh = mScene->mMeshes[pNode->mMeshes[a]];
        // do not instantiate mesh if empty. I wonder how this could happen
        if( mesh->mNumFaces == 0 || mesh->mNumVertices == 0 )
            continue;

        const std::string meshName = mesh->mName.length == 0 ? GetMeshId(pNode->mMeshes[a]) : mesh->mName.C_Str();

        if( mesh->mNumBones == 0 )
        {
            mOutput << startstr << "<instance_geometry url=\"#" << XMLIDEncode(meshName) << "\">" << endstr;
            PushTag();
        }
        else
        {
            mOutput << startstr
                    << "<instance_controller url=\"#" << XMLIDEncode(meshName) << "-skin\">"
                    << endstr;
            PushTag();

			// note! this mFoundSkeletonRootNodeID some how affects animation, it makes the mesh attaches to armature skeleton root node.
			// use the first bone to find skeleton root
			const aiNode * skeletonRootBoneNode = findSkeletonRootNode( pScene, mesh );
			if ( skeletonRootBoneNode ) {
				mFoundSkeletonRootNodeID = XMLIDEncode( skeletonRootBoneNode->mName.C_Str() );
			}
            mOutput << startstr << "<skeleton>#" << mFoundSkeletonRootNodeID << "</skeleton>" << endstr;
        }
        mOutput << startstr << "<bind_material>" << endstr;
        PushTag();
        mOutput << startstr << "<technique_common>" << endstr;
        PushTag();
        mOutput << startstr << "<instance_material symbol=\"defaultMaterial\" target=\"#" << XMLIDEncode(materials[mesh->mMaterialIndex].name) << "\">" << endstr;
        PushTag();
        for( size_t a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a )
        {
            if( mesh->HasTextureCoords( static_cast<unsigned int>(a) ) )
                // semantic       as in <texture texcoord=...>
                // input_semantic as in <input semantic=...>
                // input_set      as in <input set=...>
                mOutput << startstr << "<bind_vertex_input semantic=\"CHANNEL" << a << "\" input_semantic=\"TEXCOORD\" input_set=\"" << a << "\"/>" << endstr;
        }
        PopTag();
        mOutput << startstr << "</instance_material>" << endstr;
        PopTag();
        mOutput << startstr << "</technique_common>" << endstr;
        PopTag();
        mOutput << startstr << "</bind_material>" << endstr;
        
        PopTag();
        if( mesh->mNumBones == 0)
            mOutput << startstr << "</instance_geometry>" << endstr;
        else
            mOutput << startstr << "</instance_controller>" << endstr;
    }

    // recurse into subnodes
    for( size_t a = 0; a < pNode->mNumChildren; ++a )
        WriteNode( pScene, pNode->mChildren[a]);

    PopTag();
    mOutput << startstr << "</node>" << endstr;
}